

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::FocusWindow(ImGuiWindow *window)

{
  ImGuiWindow *pIVar1;
  ImGuiTabBar *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiID IVar4;
  ImGuiContext *g;
  ImGuiDockNode *pIVar5;
  ImGuiWindow *window_00;
  ImGuiWindow *window_01;
  bool bVar6;
  
  pIVar3 = GImGui;
  if (GImGui->NavWindow != window) {
    GImGui->NavWindow = window;
    IVar4 = 0;
    if (window != (ImGuiWindow *)0x0) {
      if (pIVar3->NavDisableMouseHover == true) {
        pIVar3->NavMousePosDirty = true;
      }
      IVar4 = window->NavLastIds[0];
    }
    pIVar3->NavId = IVar4;
    pIVar3->NavFocusScopeId = 0;
    pIVar3->NavIdIsAlive = false;
    pIVar3->NavLayer = ImGuiNavLayer_Main;
    pIVar3->NavMoveSubmitted = false;
    pIVar3->NavMoveScoringItems = false;
    pIVar3->NavAnyRequest = false;
    pIVar3->NavInitRequest = false;
  }
  window_00 = (ImGuiWindow *)0x0;
  ClosePopupsOverWindow(window,false);
  if (window != (ImGuiWindow *)0x0) {
    if (window->RootWindowDockTree == (ImGuiWindow *)0x0) {
      __assert_fail("window == __null || window->RootWindowDockTree != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1b94,"void ImGui::FocusWindow(ImGuiWindow *)");
    }
    if (window == (ImGuiWindow *)0x0) {
      window_00 = (ImGuiWindow *)0x0;
    }
    else {
      window_00 = window->RootWindow;
    }
  }
  if (window == (ImGuiWindow *)0x0) {
    window_01 = (ImGuiWindow *)0x0;
    pIVar5 = (ImGuiDockNode *)0x0;
  }
  else {
    window_01 = window->RootWindowDockTree;
    pIVar5 = window->DockNode;
  }
  pIVar1 = pIVar3->ActiveIdWindow;
  if (pIVar5 == (ImGuiDockNode *)0x0 || pIVar1 == (ImGuiWindow *)0x0) {
    bVar6 = false;
  }
  else {
    bVar6 = pIVar5->HostWindow == pIVar1;
  }
  if ((((pIVar1 != (ImGuiWindow *)0x0) && (pIVar3->ActiveId != 0)) &&
      (pIVar1->RootWindow != window_00)) &&
     (!bVar6 && (pIVar3->ActiveIdNoClearOnFocusLoss & 1U) == 0)) {
    ClearActiveID();
  }
  if (window != (ImGuiWindow *)0x0) {
    window->LastFrameJustFocused = pIVar3->FrameCount;
    if ((pIVar5 != (ImGuiDockNode *)0x0) && (pIVar2 = pIVar5->TabBar, pIVar2 != (ImGuiTabBar *)0x0))
    {
      IVar4 = window->ID;
      pIVar2->NextSelectedTabId = IVar4;
      pIVar2->SelectedTabId = IVar4;
    }
    BringWindowToFocusFront(window_00);
    if (((uint)(window_00->Flags | window->Flags | window_01->Flags) >> 0xd & 1) == 0) {
      BringWindowToDisplayFront(window_01);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    if (g.NavWindow != window)
    {
        g.NavWindow = window;
        if (window && g.NavDisableMouseHover)
            g.NavMousePosDirty = true;
        g.NavId = window ? window->NavLastIds[0] : 0; // Restore NavId
        g.NavFocusScopeId = 0;
        g.NavIdIsAlive = false;
        g.NavLayer = ImGuiNavLayer_Main;
        g.NavInitRequest = g.NavMoveSubmitted = g.NavMoveScoringItems = false;
        NavUpdateAnyRequestFlag();
        //IMGUI_DEBUG_LOG("FocusWindow(\"%s\")\n", window ? window->Name : NULL);
    }

    // Close popups if any
    ClosePopupsOverWindow(window, false);

    // Move the root window to the top of the pile
    IM_ASSERT(window == NULL || window->RootWindowDockTree != NULL);
    ImGuiWindow* focus_front_window = window ? window->RootWindow : NULL;
    ImGuiWindow* display_front_window = window ? window->RootWindowDockTree : NULL;
    ImGuiDockNode* dock_node = window ? window->DockNode : NULL;
    bool active_id_window_is_dock_node_host = (g.ActiveIdWindow && dock_node && dock_node->HostWindow == g.ActiveIdWindow);

    // Steal active widgets. Some of the cases it triggers includes:
    // - Focus a window while an InputText in another window is active, if focus happens before the old InputText can run.
    // - When using Nav to activate menu items (due to timing of activating on press->new window appears->losing ActiveId)
    // - Using dock host items (tab, collapse button) can trigger this before we redirect the ActiveIdWindow toward the child window.
    if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != focus_front_window)
        if (!g.ActiveIdNoClearOnFocusLoss && !active_id_window_is_dock_node_host)
            ClearActiveID();

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;
    window->LastFrameJustFocused = g.FrameCount;

    // Select in dock node
    if (dock_node && dock_node->TabBar)
        dock_node->TabBar->SelectedTabId = dock_node->TabBar->NextSelectedTabId = window->ID;

    // Bring to front
    BringWindowToFocusFront(focus_front_window);
    if (((window->Flags | focus_front_window->Flags | display_front_window->Flags) & ImGuiWindowFlags_NoBringToFrontOnFocus) == 0)
        BringWindowToDisplayFront(display_front_window);
}